

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t
b_find_first_greater_or_equal
          (ion_bpp_handle_t handle,void *key,void *mkey,ion_bpp_external_address_t *rec)

{
  ion_bpp_node_t *piVar1;
  ion_bpp_key_t *piVar2;
  ion_bpp_buffer_t *piVar3;
  int iVar4;
  ion_bpp_err_t iVar5;
  ion_bpp_address_t adr;
  ion_bpp_key_t *lgeqkey;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *local_48;
  ion_bpp_buffer_t *local_40;
  ion_bpp_external_address_t *local_38;
  
  local_40 = (ion_bpp_buffer_t *)((long)handle + 0x20);
  local_38 = rec;
  if ((**(byte **)((long)handle + 0x38) & 1) == 0) {
    do {
      iVar4 = search(handle,local_40,key,0,&local_48,MODE_LLEQ);
      if (iVar4 < 0) {
        adr = *(ion_bpp_address_t *)(local_48 + -8);
      }
      else {
        adr = *(ion_bpp_address_t *)(local_48 + (long)*(int *)((long)handle + 8) + 8);
      }
      iVar5 = readDisk(handle,adr,&local_40);
      if (iVar5 != bErrOk) {
        return iVar5;
      }
    } while ((undefined1  [40])((undefined1  [40])*local_40->p & (undefined1  [40])0x1) ==
             (undefined1  [40])0x0);
  }
  piVar3 = local_40;
  iVar4 = search(handle,local_40,key,0,&local_48,MODE_LLEQ);
  if (0 < iVar4) {
    piVar1 = piVar3->p;
    if ((long)(local_48 + (-0x20 - (long)piVar1)) / (long)*(int *)((long)handle + 0xbc) ==
        (ulong)(*(ushort *)piVar1 >> 1)) {
      return bErrKeyNotFound;
    }
    local_48 = local_48 + *(int *)((long)handle + 0xbc);
  }
  piVar2 = local_48;
  *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar3;
  *(ion_bpp_key_t **)((long)handle + 0xb0) = local_48;
  memcpy(mkey,local_48,(long)*(int *)((long)handle + 8));
  *local_38 = *(ion_bpp_external_address_t *)(piVar2 + *(int *)((long)handle + 8));
  return bErrOk;
}

Assistant:

ion_bpp_err_t
b_find_first_greater_or_equal(
	ion_bpp_handle_t			handle,
	void						*key,
	void						*mkey,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_key_t		*lgeqkey;			/* matched key */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */
	int					cc;

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	/* find key, and return address */
	while (1) {
		if (leaf(buf)) {
			if ((cc = search(handle, buf, key, 0, &lgeqkey, MODE_LLEQ)) > 0) {
				if ((lgeqkey - fkey(buf)) / (h->ks) == (ct(buf))) {
					return bErrKeyNotFound;
				}

				lgeqkey += ks(1);
			}

			h->curBuf	= buf;
			h->curKey	= lgeqkey;
			memcpy(mkey, key(lgeqkey), h->keySize);
			*rec		= rec(lgeqkey);

			return bErrOk;
		}
		else {
			cc = search(handle, buf, key, 0, &lgeqkey, MODE_LLEQ);

			if (cc < 0) {
				if ((rc = readDisk(handle, childLT(lgeqkey), &buf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(lgeqkey), &buf)) != 0) {
					return rc;
				}
			}
		}
	}
}